

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void detachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  int iVar1;
  sqlite3 *db_00;
  char local_c8 [8];
  char zErr [128];
  Db *local_40;
  Db *pDb;
  int i;
  sqlite3 *db;
  char *zName;
  sqlite3_value **argv_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  db = (sqlite3 *)sqlite3_value_text(*argv);
  db_00 = sqlite3_context_db_handle(context);
  local_40 = (Db *)0x0;
  if (db == (sqlite3 *)0x0) {
    db = (sqlite3 *)0x22fef2;
  }
  pDb._4_4_ = 0;
  while ((pDb._4_4_ < db_00->nDb &&
         ((local_40 = db_00->aDb + pDb._4_4_, local_40->pBt == (Btree *)0x0 ||
          (iVar1 = sqlite3StrICmp(local_40->zDbSName,(char *)db), iVar1 != 0))))) {
    pDb._4_4_ = pDb._4_4_ + 1;
  }
  if (pDb._4_4_ < db_00->nDb) {
    if (pDb._4_4_ < 2) {
      sqlite3_snprintf(0x80,local_c8,"cannot detach database %s",db);
    }
    else {
      iVar1 = sqlite3BtreeIsInReadTrans(local_40->pBt);
      if ((iVar1 == 0) && (iVar1 = sqlite3BtreeIsInBackup(local_40->pBt), iVar1 == 0)) {
        sqlite3BtreeClose(local_40->pBt);
        local_40->pBt = (Btree *)0x0;
        local_40->pSchema = (Schema *)0x0;
        sqlite3CollapseDatabaseArray(db_00);
        return;
      }
      sqlite3_snprintf(0x80,local_c8,"database %s is locked",db);
    }
  }
  else {
    sqlite3_snprintf(0x80,local_c8,"no such database: %s",db);
  }
  sqlite3_result_error(context,local_c8,-1);
  return;
}

Assistant:

static void detachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  const char *zName = (const char *)sqlite3_value_text(argv[0]);
  sqlite3 *db = sqlite3_context_db_handle(context);
  int i;
  Db *pDb = 0;
  char zErr[128];

  UNUSED_PARAMETER(NotUsed);

  if( zName==0 ) zName = "";
  for(i=0; i<db->nDb; i++){
    pDb = &db->aDb[i];
    if( pDb->pBt==0 ) continue;
    if( sqlite3StrICmp(pDb->zDbSName, zName)==0 ) break;
  }

  if( i>=db->nDb ){
    sqlite3_snprintf(sizeof(zErr),zErr, "no such database: %s", zName);
    goto detach_error;
  }
  if( i<2 ){
    sqlite3_snprintf(sizeof(zErr),zErr, "cannot detach database %s", zName);
    goto detach_error;
  }
  if( sqlite3BtreeIsInReadTrans(pDb->pBt) || sqlite3BtreeIsInBackup(pDb->pBt) ){
    sqlite3_snprintf(sizeof(zErr),zErr, "database %s is locked", zName);
    goto detach_error;
  }

  sqlite3BtreeClose(pDb->pBt);
  pDb->pBt = 0;
  pDb->pSchema = 0;
  sqlite3CollapseDatabaseArray(db);
  return;

detach_error:
  sqlite3_result_error(context, zErr, -1);
}